

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O2

MSize tab_len_slow(GCtab *t,size_t hi)

{
  uint uVar1;
  cTValue *pcVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = t->asize;
  uVar6 = hi + 1;
  do {
    uVar4 = uVar6;
    uVar3 = (uint)uVar4;
    if (uVar3 < uVar1) {
      pcVar2 = (cTValue *)((long)(int)uVar3 * 8 + (t->array).ptr64);
    }
    else {
      pcVar2 = lj_tab_getinth(t,uVar3);
    }
    if ((pcVar2 == (cTValue *)0x0) || (pcVar2->u64 == 0xffffffffffffffff)) goto LAB_00110ff7;
    uVar6 = uVar4 * 2;
    hi = uVar4;
  } while (uVar4 < 0x3fffffff);
  uVar3 = 0;
  lVar5 = 0x100000000;
  do {
    hi = (size_t)uVar3;
    uVar3 = uVar3 + 1;
    if (uVar3 < uVar1) {
      pcVar2 = (cTValue *)((lVar5 >> 0x1d) + (t->array).ptr64);
    }
    else {
      pcVar2 = lj_tab_getinth(t,uVar3);
    }
  } while ((pcVar2 != (cTValue *)0x0) &&
          (lVar5 = lVar5 + 0x100000000, pcVar2->u64 != 0xffffffffffffffff));
LAB_00110fdf:
  return (MSize)hi;
LAB_00110ff7:
  while (uVar6 = uVar4, 1 < uVar6 - hi) {
    uVar7 = uVar6 + hi >> 1;
    uVar3 = (uint)uVar7;
    if (uVar3 < uVar1) {
      pcVar2 = (cTValue *)((long)(int)uVar3 * 8 + (t->array).ptr64);
    }
    else {
      pcVar2 = lj_tab_getinth(t,uVar3);
    }
    uVar4 = uVar7;
    if ((pcVar2 != (cTValue *)0x0) && (pcVar2->u64 != 0xffffffffffffffff)) {
      uVar4 = uVar6;
      hi = uVar7;
    }
  }
  goto LAB_00110fdf;
}

Assistant:

LJ_NOINLINE static MSize tab_len_slow(GCtab *t, size_t hi)
{
  cTValue *tv;
  size_t lo = hi;
  hi++;
  /* Widening search for an upper bound. */
  while ((tv = lj_tab_getint(t, (int32_t)hi)) && !tvisnil(tv)) {
    lo = hi;
    hi += hi;
    if (hi > (size_t)(INT_MAX-2)) {  /* Punt and do a linear search. */
      lo = 1;
      while ((tv = lj_tab_getint(t, (int32_t)lo)) && !tvisnil(tv)) lo++;
      return (MSize)(lo - 1);
    }
  }
  /* Binary search to find a non-nil to nil transition. */
  while (hi - lo > 1) {
    size_t mid = (lo+hi) >> 1;
    cTValue *tvb = lj_tab_getint(t, (int32_t)mid);
    if (tvb && !tvisnil(tvb)) lo = mid; else hi = mid;
  }
  return (MSize)lo;
}